

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_sse42_intr.c
# Opt level: O0

void ihevc_intra_pred_chroma_planar_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  short sVar7;
  undefined4 uVar8;
  undefined6 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  short sVar12;
  short sVar13;
  undefined1 (*pauVar14) [16];
  int in_ECX;
  long in_RDX;
  long lVar15;
  long in_RDI;
  int in_R8D;
  short sVar16;
  ushort uVar17;
  short sVar19;
  ushort uVar20;
  undefined1 auVar18 [16];
  ulong uVar21;
  __m128i zero_8x16b;
  __m128i const_temp6_4x32b;
  __m128i const_temp5_4x32b;
  __m128i col_8x16b;
  __m128i const_temp4_4x32b;
  __m128i const_temp3_4x32b;
  __m128i const_temp2_4x32b;
  __m128i const_temp1_4x32b;
  __m128i const_temp_4x32b;
  WORD32 three_nt;
  WORD32 two_nt;
  WORD32 log2nt;
  WORD32 col;
  WORD32 row;
  char cStack_4e6;
  undefined1 uStack_4e5;
  char cStack_4e4;
  undefined1 uStack_4e3;
  char cStack_4e2;
  undefined1 uStack_4e1;
  char cStack_4de;
  undefined1 uStack_4dd;
  char cStack_4dc;
  undefined1 uStack_4db;
  char cStack_4da;
  undefined1 uStack_4d9;
  short local_488;
  short sStack_486;
  short sStack_484;
  short sStack_482;
  short sStack_480;
  short sStack_47e;
  short sStack_47c;
  short sStack_47a;
  undefined8 local_478;
  undefined8 uStack_470;
  int local_408;
  int local_404;
  uint local_400;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1ae;
  ushort uStack_1ac;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  ushort uStack_196;
  ushort uStack_194;
  ushort uStack_18e;
  ushort uStack_18c;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  ushort uStack_166;
  ushort uStack_164;
  ushort uStack_15e;
  ushort uStack_15c;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  ushort uStack_76;
  ushort uStack_74;
  ushort uStack_72;
  __m128i src_temp_8x16b;
  __m128i res_temp3_8x16b;
  __m128i res_temp2_8x16b;
  __m128i res_temp1_8x16b;
  __m128i row_8x16b;
  __m128i res_temp_8x16b;
  __m128i const_temp7_4x32b;
  
  local_408 = 5;
  if (in_R8D == 4) {
    local_408 = 2;
  }
  else if (in_R8D == 8) {
    local_408 = 3;
  }
  else if (in_R8D == 0x10) {
    local_408 = 4;
  }
  lVar15 = (long)(in_R8D * 6 + 2);
  bVar1 = *(byte *)(in_RDI + 1 + lVar15);
  bVar2 = *(byte *)(in_RDI + lVar15);
  lVar15 = (long)(in_R8D * 2 + -2);
  bVar3 = *(byte *)(in_RDI + 1 + lVar15);
  bVar4 = *(byte *)(in_RDI + lVar15);
  sVar7 = (short)in_R8D;
  if (in_R8D % 4 == 0) {
    for (local_400 = 0; (int)local_400 < in_R8D; local_400 = local_400 + 1) {
      lVar15 = (long)(int)((~local_400 + in_R8D * 2) * 2);
      bVar5 = *(byte *)(in_RDI + 1 + lVar15);
      bVar6 = *(byte *)(in_RDI + lVar15);
      sVar12 = (ushort)local_400 + 1;
      sVar13 = ~(ushort)local_400 + sVar7;
      local_478 = 0x2000200010001;
      uStack_470 = 0x4000400030003;
      _local_488 = CONCAT22(sVar7 + -1,sVar7 + -1);
      _local_488 = CONCAT24(sVar7 + -2,_local_488);
      _local_488 = CONCAT26(sVar7 + -2,_local_488);
      _sStack_480 = CONCAT22(sVar7 + -3,sVar7 + -3);
      _sStack_480 = CONCAT24(sVar7 + -4,_sStack_480);
      _sStack_480 = CONCAT26(sVar7 + -4,_sStack_480);
      uStack_166 = (ushort)bVar3;
      uStack_164 = (ushort)bVar4;
      uStack_15e = (ushort)bVar3;
      uStack_15c = (ushort)bVar4;
      for (local_404 = 0; SBORROW4(local_404,in_R8D * 2) != local_404 + in_R8D * -2 < 0;
          local_404 = local_404 + 8) {
        pauVar14 = (undefined1 (*) [16])(in_RDI + (in_R8D * 4 + 2) + (long)local_404);
        auVar18 = pmovzxbw(*pauVar14,*(undefined8 *)*pauVar14);
        local_178 = auVar18._0_2_;
        sStack_176 = auVar18._2_2_;
        sStack_174 = auVar18._4_2_;
        sStack_172 = auVar18._6_2_;
        sStack_170 = auVar18._8_2_;
        sStack_16e = auVar18._10_2_;
        sStack_16c = auVar18._12_2_;
        sStack_16a = auVar18._14_2_;
        cStack_4e6 = (char)(sStack_176 * sVar13);
        uStack_4e5 = (undefined1)((ushort)(sStack_176 * sVar13) >> 8);
        cStack_4e4 = (char)(sStack_174 * sVar13);
        uStack_4e3 = (undefined1)((ushort)(sStack_174 * sVar13) >> 8);
        cStack_4e2 = (char)(sStack_172 * sVar13);
        uStack_4e1 = (undefined1)((ushort)(sStack_172 * sVar13) >> 8);
        cStack_4de = (char)(sStack_16e * sVar13);
        uStack_4dd = (undefined1)((ushort)(sStack_16e * sVar13) >> 8);
        cStack_4dc = (char)(sStack_16c * sVar13);
        uStack_4db = (undefined1)((ushort)(sStack_16c * sVar13) >> 8);
        cStack_4da = (char)(sStack_16a * sVar13);
        uStack_4d9 = (undefined1)((ushort)(sStack_16a * sVar13) >> 8);
        uStack_196 = (ushort)bVar1;
        uStack_194 = (ushort)bVar2;
        uStack_18e = (ushort)bVar1;
        uStack_18c = (ushort)bVar2;
        local_1a8 = (short)local_478;
        sStack_1a6 = (short)((ulong)local_478 >> 0x10);
        sStack_1a4 = (short)((ulong)local_478 >> 0x20);
        sStack_1a2 = (short)((ulong)local_478 >> 0x30);
        sStack_1a0 = (short)uStack_470;
        sStack_19e = (short)((ulong)uStack_470 >> 0x10);
        sStack_19c = (short)((ulong)uStack_470 >> 0x20);
        sStack_19a = (short)((ulong)uStack_470 >> 0x30);
        uStack_1b6 = (ushort)bVar5;
        uStack_1b4 = (ushort)bVar6;
        uStack_1ae = (ushort)bVar5;
        uStack_1ac = (ushort)bVar6;
        local_1c8 = (short)_local_488;
        sStack_1c6 = (short)((ulong)_local_488 >> 0x10);
        sStack_1c4 = (short)((ulong)_local_488 >> 0x20);
        sStack_1c2 = (short)((ulong)_local_488 >> 0x30);
        sStack_1c0 = (short)_sStack_480;
        sStack_1be = (short)((ulong)_sStack_480 >> 0x10);
        sStack_1bc = (short)((ulong)_sStack_480 >> 0x20);
        sStack_1ba = (short)((ulong)_sStack_480 >> 0x30);
        uVar8 = CONCAT13(uStack_4e5,CONCAT12(cStack_4e6,local_178 * sVar13));
        uVar9 = CONCAT15(uStack_4e3,CONCAT14(cStack_4e4,uVar8));
        uVar10 = CONCAT13(uStack_4dd,CONCAT12(cStack_4de,sStack_170 * sVar13));
        uVar11 = CONCAT15(uStack_4db,CONCAT14(cStack_4dc,uVar10));
        sStack_e6 = (short)((uint)uVar8 >> 0x10);
        sStack_e4 = (short)((uint6)uVar9 >> 0x20);
        sStack_e2 = (short)(CONCAT17(uStack_4e1,CONCAT16(cStack_4e2,uVar9)) >> 0x30);
        sStack_de = (short)((uint)uVar10 >> 0x10);
        sStack_dc = (short)((uint6)uVar11 >> 0x20);
        sStack_da = (short)(CONCAT17(uStack_4d9,CONCAT16(cStack_4da,uVar11)) >> 0x30);
        sVar16 = sVar12 * (ushort)bVar4 + sVar7 + local_178 * sVar13;
        sStack_e6 = sVar12 * uStack_166 + sVar7 + sStack_e6;
        sStack_e4 = sVar12 * uStack_164 + sVar7 + sStack_e4;
        sStack_e2 = sVar12 * (ushort)bVar3 + sVar7 + sStack_e2;
        sVar19 = sVar12 * (ushort)bVar4 + sVar7 + sStack_170 * sVar13;
        sStack_de = sVar12 * uStack_15e + sVar7 + sStack_de;
        sStack_dc = sVar12 * uStack_15c + sVar7 + sStack_dc;
        sStack_da = sVar12 * (ushort)bVar3 + sVar7 + sStack_da;
        cStack_4e6 = (char)sStack_e6;
        uStack_4e5 = (undefined1)((ushort)sStack_e6 >> 8);
        cStack_4e4 = (char)sStack_e4;
        uStack_4e3 = (undefined1)((ushort)sStack_e4 >> 8);
        cStack_4e2 = (char)sStack_e2;
        uStack_4e1 = (undefined1)((ushort)sStack_e2 >> 8);
        cStack_4de = (char)sStack_de;
        uStack_4dd = (undefined1)((ushort)sStack_de >> 8);
        cStack_4dc = (char)sStack_dc;
        uStack_4db = (undefined1)((ushort)sStack_dc >> 8);
        cStack_4da = (char)sStack_da;
        uStack_4d9 = (undefined1)((ushort)sStack_da >> 8);
        uVar8 = CONCAT13(uStack_4e5,CONCAT12(cStack_4e6,sVar16));
        uVar9 = CONCAT15(uStack_4e3,CONCAT14(cStack_4e4,uVar8));
        uVar10 = CONCAT13(uStack_4dd,CONCAT12(cStack_4de,sVar19));
        uVar11 = CONCAT15(uStack_4db,CONCAT14(cStack_4dc,uVar10));
        sStack_f6 = (short)((uint)uVar8 >> 0x10);
        sStack_f4 = (short)((uint6)uVar9 >> 0x20);
        sStack_f2 = (short)(CONCAT17(uStack_4e1,CONCAT16(cStack_4e2,uVar9)) >> 0x30);
        sStack_ee = (short)((uint)uVar10 >> 0x10);
        sStack_ec = (short)((uint6)uVar11 >> 0x20);
        sStack_ea = (short)(CONCAT17(uStack_4d9,CONCAT16(cStack_4da,uVar11)) >> 0x30);
        sVar16 = sVar16 + (ushort)bVar2 * local_1a8;
        sStack_f6 = sStack_f6 + uStack_196 * sStack_1a6;
        sStack_f4 = sStack_f4 + uStack_194 * sStack_1a4;
        sStack_f2 = sStack_f2 + (ushort)bVar1 * sStack_1a2;
        sVar19 = sVar19 + (ushort)bVar2 * sStack_1a0;
        sStack_ee = sStack_ee + uStack_18e * sStack_19e;
        sStack_ec = sStack_ec + uStack_18c * sStack_19c;
        sStack_ea = sStack_ea + (ushort)bVar1 * sStack_19a;
        cStack_4e6 = (char)sStack_f6;
        uStack_4e5 = (undefined1)((ushort)sStack_f6 >> 8);
        cStack_4e4 = (char)sStack_f4;
        uStack_4e3 = (undefined1)((ushort)sStack_f4 >> 8);
        cStack_4e2 = (char)sStack_f2;
        uStack_4e1 = (undefined1)((ushort)sStack_f2 >> 8);
        cStack_4de = (char)sStack_ee;
        uStack_4dd = (undefined1)((ushort)sStack_ee >> 8);
        cStack_4dc = (char)sStack_ec;
        uStack_4db = (undefined1)((ushort)sStack_ec >> 8);
        cStack_4da = (char)sStack_ea;
        uStack_4d9 = (undefined1)((ushort)sStack_ea >> 8);
        uVar8 = CONCAT13(uStack_4e5,CONCAT12(cStack_4e6,sVar16));
        uVar9 = CONCAT15(uStack_4e3,CONCAT14(cStack_4e4,uVar8));
        uVar10 = CONCAT13(uStack_4dd,CONCAT12(cStack_4de,sVar19));
        uVar11 = CONCAT15(uStack_4db,CONCAT14(cStack_4dc,uVar10));
        sStack_116 = (short)((uint)uVar8 >> 0x10);
        sStack_114 = (short)((uint6)uVar9 >> 0x20);
        sStack_112 = (short)(CONCAT17(uStack_4e1,CONCAT16(cStack_4e2,uVar9)) >> 0x30);
        sStack_10e = (short)((uint)uVar10 >> 0x10);
        sStack_10c = (short)((uint6)uVar11 >> 0x20);
        sStack_10a = (short)(CONCAT17(uStack_4d9,CONCAT16(cStack_4da,uVar11)) >> 0x30);
        uVar17 = sVar16 + (ushort)bVar6 * local_1c8;
        sStack_116 = sStack_116 + uStack_1b6 * sStack_1c6;
        sStack_114 = sStack_114 + uStack_1b4 * sStack_1c4;
        sStack_112 = sStack_112 + (ushort)bVar5 * sStack_1c2;
        uVar20 = sVar19 + (ushort)bVar6 * sStack_1c0;
        sStack_10e = sStack_10e + uStack_1ae * sStack_1be;
        sStack_10c = sStack_10c + uStack_1ac * sStack_1bc;
        sStack_10a = sStack_10a + (ushort)bVar5 * sStack_1ba;
        cStack_4e6 = (char)sStack_116;
        uStack_4e5 = (undefined1)((ushort)sStack_116 >> 8);
        cStack_4e4 = (char)sStack_114;
        uStack_4e3 = (undefined1)((ushort)sStack_114 >> 8);
        cStack_4e2 = (char)sStack_112;
        uStack_4e1 = (undefined1)((ushort)sStack_112 >> 8);
        cStack_4de = (char)sStack_10e;
        uStack_4dd = (undefined1)((ushort)sStack_10e >> 8);
        cStack_4dc = (char)sStack_10c;
        uStack_4db = (undefined1)((ushort)sStack_10c >> 8);
        cStack_4da = (char)sStack_10a;
        uStack_4d9 = (undefined1)((ushort)sStack_10a >> 8);
        uVar8 = CONCAT13(uStack_4e5,CONCAT12(cStack_4e6,uVar17));
        uVar9 = CONCAT15(uStack_4e3,CONCAT14(cStack_4e4,uVar8));
        uVar10 = CONCAT13(uStack_4dd,CONCAT12(cStack_4de,uVar20));
        uVar11 = CONCAT15(uStack_4db,CONCAT14(cStack_4dc,uVar10));
        uStack_76 = (ushort)((uint)uVar8 >> 0x10);
        uStack_74 = (ushort)((uint6)uVar9 >> 0x20);
        uStack_72 = (ushort)(CONCAT17(uStack_4e1,CONCAT16(cStack_4e2,uVar9)) >> 0x30);
        src_temp_8x16b[0]._2_2_ = (ushort)((uint)uVar10 >> 0x10);
        src_temp_8x16b[0]._4_2_ = (ushort)((uint6)uVar11 >> 0x20);
        src_temp_8x16b[0]._6_2_ = (ushort)(CONCAT17(uStack_4d9,CONCAT16(cStack_4da,uVar11)) >> 0x30)
        ;
        uVar21 = (ulong)(local_408 + 1);
        uVar17 = uVar17 >> uVar21;
        uVar20 = uVar20 >> uVar21;
        cStack_4e6 = (char)(uStack_76 >> uVar21);
        uStack_4e5 = (undefined1)((uStack_76 >> uVar21) >> 8);
        cStack_4e4 = (char)(uStack_74 >> uVar21);
        uStack_4e3 = (undefined1)((uStack_74 >> uVar21) >> 8);
        cStack_4e2 = (char)(uStack_72 >> uVar21);
        uStack_4e1 = (undefined1)((uStack_72 >> uVar21) >> 8);
        cStack_4de = (char)(src_temp_8x16b[0]._2_2_ >> uVar21);
        uStack_4dd = (undefined1)((src_temp_8x16b[0]._2_2_ >> uVar21) >> 8);
        cStack_4dc = (char)(src_temp_8x16b[0]._4_2_ >> uVar21);
        uStack_4db = (undefined1)((src_temp_8x16b[0]._4_2_ >> uVar21) >> 8);
        cStack_4da = (char)(src_temp_8x16b[0]._6_2_ >> uVar21);
        uStack_4d9 = (undefined1)((src_temp_8x16b[0]._6_2_ >> uVar21) >> 8);
        uVar8 = CONCAT13(uStack_4e5,CONCAT12(cStack_4e6,uVar17));
        uVar9 = CONCAT15(uStack_4e3,CONCAT14(cStack_4e4,uVar8));
        uVar10 = CONCAT13(uStack_4dd,CONCAT12(cStack_4de,uVar20));
        uVar11 = CONCAT15(uStack_4db,CONCAT14(cStack_4dc,uVar10));
        res_temp3_8x16b[1]._2_2_ = (short)((uint)uVar8 >> 0x10);
        res_temp3_8x16b[1]._4_2_ = (short)((uint6)uVar9 >> 0x20);
        res_temp3_8x16b[1]._6_2_ = (short)(CONCAT17(uStack_4e1,CONCAT16(cStack_4e2,uVar9)) >> 0x30);
        res_temp2_8x16b[0]._2_2_ = (short)((uint)uVar10 >> 0x10);
        res_temp2_8x16b[0]._4_2_ = (short)((uint6)uVar11 >> 0x20);
        res_temp2_8x16b[0]._6_2_ = (short)(CONCAT17(uStack_4d9,CONCAT16(cStack_4da,uVar11)) >> 0x30)
        ;
        *(ulong *)(in_RDX + (int)(local_400 * in_ECX) + (long)local_404) =
             CONCAT17((0 < res_temp2_8x16b[0]._6_2_) * (res_temp2_8x16b[0]._6_2_ < 0x100) *
                      cStack_4da - (0xff < res_temp2_8x16b[0]._6_2_),
                      CONCAT16((0 < res_temp2_8x16b[0]._4_2_) * (res_temp2_8x16b[0]._4_2_ < 0x100) *
                               cStack_4dc - (0xff < res_temp2_8x16b[0]._4_2_),
                               CONCAT15((0 < res_temp2_8x16b[0]._2_2_) *
                                        (res_temp2_8x16b[0]._2_2_ < 0x100) * cStack_4de -
                                        (0xff < res_temp2_8x16b[0]._2_2_),
                                        CONCAT14((0 < (short)uVar20) * ((short)uVar20 < 0x100) *
                                                 (char)uVar20 - (0xff < (short)uVar20),
                                                 CONCAT13((0 < res_temp3_8x16b[1]._6_2_) *
                                                          (res_temp3_8x16b[1]._6_2_ < 0x100) *
                                                          cStack_4e2 -
                                                          (0xff < res_temp3_8x16b[1]._6_2_),
                                                          CONCAT12((0 < res_temp3_8x16b[1]._4_2_) *
                                                                   (res_temp3_8x16b[1]._4_2_ < 0x100
                                                                   ) * cStack_4e4 -
                                                                   (0xff < res_temp3_8x16b[1]._4_2_)
                                                                   ,CONCAT11((0 < res_temp3_8x16b[1]
                                                                                  ._2_2_) *
                                                                             (res_temp3_8x16b[1].
                                                                              _2_2_ < 0x100) *
                                                                             cStack_4e6 -
                                                                             (0xff < res_temp3_8x16b
                                                                                     [1]._2_2_),
                                                                             (0 < (short)uVar17) *
                                                                             ((short)uVar17 < 0x100)
                                                                             * (char)uVar17 -
                                                                             (0xff < (short)uVar17))
                                                                  ))))));
        _local_488 = CONCAT22(sStack_1c6 + -4,local_1c8 + -4);
        _local_488 = CONCAT24(sStack_1c4 + -4,_local_488);
        _local_488 = CONCAT26(sStack_1c2 + -4,_local_488);
        _sStack_480 = CONCAT22(sStack_1be + -4,sStack_1c0 + -4);
        _sStack_480 = CONCAT24(sStack_1bc + -4,_sStack_480);
        _sStack_480 = CONCAT26(sStack_1ba + -4,_sStack_480);
        local_478 = CONCAT26(sStack_1a2 + 4,
                             CONCAT24(sStack_1a4 + 4,CONCAT22(sStack_1a6 + 4,local_1a8 + 4)));
        uStack_470 = CONCAT26(sStack_19a + 4,
                              CONCAT24(sStack_19c + 4,CONCAT22(sStack_19e + 4,sStack_1a0 + 4)));
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_planar_sse42(UWORD8 *pu1_ref,
                                          WORD32 src_strd,
                                          UWORD8 *pu1_dst,
                                          WORD32 dst_strd,
                                          WORD32 nt,
                                          WORD32 mode)
{

    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;

    __m128i const_temp_4x32b, const_temp1_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i col_8x16b, const_temp5_4x32b, const_temp6_4x32b, zero_8x16b, const_temp7_4x32b;
    UNUSED(src_strd);
    UNUSED(mode);

    switch(nt)
    {
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    /* Planar filtering */

/* setting vallues in  registera*/

//  pu1_ref[2*(two_nt - 1 - row)]
//  pu1_ref[2 * (three_nt + 1)]
//  pu1_ref[2 * (two_nt + 1) + col]
//  pu1_ref[2 * (nt - 1)]

    const_temp_4x32b  = _mm_set_epi16(pu1_ref[2 * (three_nt + 1) + 1], pu1_ref[2 * (three_nt + 1)], pu1_ref[2 * (three_nt + 1) + 1],
                                      pu1_ref[2 * (three_nt + 1)], pu1_ref[2 * (three_nt + 1) + 1], pu1_ref[2 * (three_nt + 1)],
                                      pu1_ref[2 * (three_nt + 1) + 1], pu1_ref[2 * (three_nt + 1)]);

    const_temp1_4x32b = _mm_set_epi16(pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)], pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)],
                                      pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)], pu1_ref[2 * (nt - 1) + 1], pu1_ref[2 * (nt - 1)]);

    const_temp4_4x32b = _mm_set1_epi16(nt - 1);
    const_temp6_4x32b = _mm_set1_epi16(nt);
    const_temp7_4x32b = _mm_set1_epi16(4);

    zero_8x16b = _mm_set1_epi32(0);

    if(nt % 4 == 0)
    {
        const_temp7_4x32b = _mm_set1_epi16(4);

        for(row = 0; row < nt; row++)
        {
            __m128i res_temp_8x16b, row_8x16b, res_temp1_8x16b, res_temp2_8x16b;
            __m128i res_temp3_8x16b;

            const_temp2_4x32b  = _mm_set_epi16(pu1_ref[2 * (two_nt - 1 - row) + 1], pu1_ref[2 * (two_nt - 1 - row)], pu1_ref[2 * (two_nt - 1 - row) + 1],
                                               pu1_ref[2 * (two_nt - 1 - row)], pu1_ref[2 * (two_nt - 1 - row) + 1], pu1_ref[2 * (two_nt - 1 - row)],
                                               pu1_ref[2 * (two_nt - 1 - row) + 1], pu1_ref[2 * (two_nt - 1 - row)]);

            const_temp3_4x32b  = _mm_set1_epi16((row + 1));
            row_8x16b = _mm_set1_epi16((nt - 1 - row));

            const_temp5_4x32b = _mm_set_epi16(3, 3, 2, 2, 1, 1, 0, 0);
            col_8x16b = _mm_set_epi16(4, 4, 3, 3, 2, 2, 1, 1);

            const_temp5_4x32b = _mm_sub_epi16(const_temp4_4x32b, const_temp5_4x32b);

            /*(row + 1) * pu1_ref[nt - 1]*/
            res_temp_8x16b  = _mm_mullo_epi16(const_temp3_4x32b,  const_temp1_4x32b);

            /*(row + 1) * pu1_ref[nt - 1] + nt)*/
            res_temp_8x16b = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);

            for(col = 0; col < 2 * nt; col += 8)
            {
                __m128i src_temp_8x16b;

                /* loding 8bit 16 pixles*/
                src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + 2 * (two_nt + 1) + col));

                src_temp_8x16b =  _mm_cvtepu8_epi16(src_temp_8x16b); /* row=0*/

                /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] */
                res_temp1_8x16b  = _mm_mullo_epi16(src_temp_8x16b,  row_8x16b);

                /*(col + 1) * pu1_ref[three_nt + 1]*/
                res_temp2_8x16b  = _mm_mullo_epi16(const_temp_4x32b,  col_8x16b);

                /*(nt - 1 - col)* pu1_ref[two_nt - 1 - row]*/
                res_temp3_8x16b  = _mm_mullo_epi16(const_temp2_4x32b,  const_temp5_4x32b);

                res_temp1_8x16b = _mm_add_epi16(res_temp_8x16b, res_temp1_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp3_8x16b);

                res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, (log2nt + 1));
                res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);

                _mm_storel_epi64((__m128i *)(pu1_dst + (row * dst_strd) + col), res_temp1_8x16b);

                const_temp5_4x32b = _mm_sub_epi16(const_temp5_4x32b, const_temp7_4x32b);
                col_8x16b = _mm_add_epi16(col_8x16b, const_temp7_4x32b);
            } /* inner loop ends here */
        }
    }
}